

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::InputArchive<cereal::JSONInputArchive,0u>::process<eos::fitting::ModelContour&>
          (InputArchive<cereal::JSONInputArchive,0u> *this,ModelContour *head)

{
  ModelContour *head_local;
  InputArchive<cereal::JSONInputArchive,_0U> *this_local;
  
  prologue<eos::fitting::ModelContour,_(cereal::traits::detail::sfinae)0>
            (*(JSONInputArchive **)(this + 0x20),head);
  InputArchive<cereal::JSONInputArchive,_0U>::
  processImpl<eos::fitting::ModelContour,_(cereal::traits::detail::sfinae)0>
            (*(InputArchive<cereal::JSONInputArchive,_0U> **)(this + 0x20),head);
  epilogue<eos::fitting::ModelContour,_(cereal::traits::detail::sfinae)0>
            (*(JSONInputArchive **)(this + 0x20),head);
  return;
}

Assistant:

inline
      void process( T && head )
      {
        prologue( *self, head );
        self->processImpl( head );
        epilogue( *self, head );
      }